

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O1

void __thiscall r_exec::GMonitor::commit(GMonitor *this)

{
  _List_node_base *p_Var1;
  PrimaryMDLController *pPVar2;
  HLPBindingMap *pHVar3;
  bool bVar4;
  Goal *this_00;
  uint64_t now;
  long lVar5;
  long lVar6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  float fVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  this_00 = _Fact::get_goal((_Fact *)(this->super__GMonitor).super_Monitor.target.object);
  now = (*Now)();
  for (p_Var7 = (this->super__GMonitor).sim_failures.mandatory_solutions.
                super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      (SimOutcomes *)p_Var7 != &(this->super__GMonitor).sim_failures; p_Var7 = p_Var7->_M_next) {
    bVar4 = Sim::is_invalidated(*(Sim **)((long)(p_Var7 + 1) + 8));
    if (!bVar4) {
      dVar10 = Goal::get_strength((Goal *)p_Var7[1]._M_next,now);
      dVar11 = Goal::get_strength(this_00,now);
      if (dVar11 < dVar10) {
        _GMonitor::invalidate_sim_outcomes(&this->super__GMonitor);
        return;
      }
    }
  }
  for (p_Var7 = (this->super__GMonitor).sim_failures.optional_solutions.
                super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var7 != (_List_node_base *)&(this->super__GMonitor).sim_failures.optional_solutions;
      p_Var7 = p_Var7->_M_next) {
    bVar4 = Sim::is_invalidated((Sim *)p_Var7[1]._M_prev);
    if (!bVar4) {
      dVar10 = Goal::get_strength((Goal *)p_Var7[1]._M_next,now);
      dVar11 = Goal::get_strength(this_00,now);
      if (dVar11 < dVar10) {
        Sim::invalidate((Sim *)p_Var7[1]._M_prev);
      }
    }
  }
  p_Var7 = (this->super__GMonitor).sim_successes.optional_solutions.
           super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  p_Var8 = (_List_node_base *)0x0;
  do {
    if (p_Var7 == (_List_node_base *)&(this->super__GMonitor).sim_successes.optional_solutions) {
      _GMonitor::invalidate_sim_outcomes(&this->super__GMonitor);
      if (p_Var8 != (_List_node_base *)0x0) {
        pPVar2 = (PrimaryMDLController *)p_Var7[1]._M_prev[3]._M_prev;
        p_Var7 = p_Var8[2]._M_prev;
        bVar4 = *(bool *)((long)&p_Var8[1]._M_prev + 1);
        pHVar3 = (HLPBindingMap *)(this->super__GMonitor).super_Monitor.bindings.object;
        fVar9 = _Fact::get_cfd((this->super__GMonitor).goal_target);
        PrimaryMDLController::abduce(pPVar2,pHVar3,(Fact *)p_Var7,bVar4,(double)fVar9);
        for (p_Var7 = (this->super__GMonitor).sim_successes.mandatory_solutions.
                      super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next;
            (SimOutcomes *)p_Var7 != &(this->super__GMonitor).sim_successes;
            p_Var7 = p_Var7->_M_next) {
          p_Var8 = *(_List_node_base **)((long)(p_Var7 + 1) + 8);
          p_Var1 = *(_List_node_base **)((long)(p_Var8 + 2) + 8);
          pPVar2 = *(PrimaryMDLController **)((long)(p_Var8 + 3) + 8);
          bVar4 = *(bool *)((long)(p_Var8 + 1) + 9);
          pHVar3 = (HLPBindingMap *)(this->super__GMonitor).super_Monitor.bindings.object;
          fVar9 = _Fact::get_cfd((this->super__GMonitor).goal_target);
          PrimaryMDLController::abduce(pPVar2,pHVar3,(Fact *)p_Var1,bVar4,(double)fVar9);
        }
      }
      return;
    }
    bVar4 = Sim::is_invalidated((Sim *)p_Var7[1]._M_prev);
    if (!bVar4) {
      p_Var1 = p_Var7[1]._M_prev;
      if (p_Var8 != (_List_node_base *)0x0) {
        lVar5 = (long)p_Var1[4]._M_prev - now;
        auVar12._8_4_ = (int)((ulong)lVar5 >> 0x20);
        auVar12._0_8_ = lVar5;
        auVar12._12_4_ = 0x45300000;
        lVar6 = (long)p_Var8[4]._M_prev - now;
        auVar13._8_4_ = (int)((ulong)lVar6 >> 0x20);
        auVar13._0_8_ = lVar6;
        auVar13._12_4_ = 0x45300000;
        if ((double)p_Var1[4]._M_next /
            ((auVar12._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) <=
            (double)p_Var8[4]._M_next /
            ((auVar13._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0))) goto LAB_001697a3;
      }
      p_Var8 = p_Var1;
    }
LAB_001697a3:
    p_Var7 = p_Var7->_M_next;
  } while( true );
}

Assistant:

void GMonitor::commit()   // the purpose is to invalidate damaging simulations; if anything remains, commit to all mandatory simulations and to the best optional one.
{
    Goal *monitored_goal = target->get_goal();
    uint64_t now = Now();
    SolutionList::const_iterator sol;

    for (sol = sim_failures.mandatory_solutions.begin(); sol != sim_failures.mandatory_solutions.end(); ++sol) { // check if any mandatory solution could result in the failure of more important a goal.
        if ((*sol).second->is_invalidated()) {
            continue;
        }

        if ((*sol).first->get_strength(now) > monitored_goal->get_strength(now)) { // cave in.
            invalidate_sim_outcomes(); // this stops any further propagation of the goal simulation.
            return;
        }
    }

    for (sol = sim_failures.optional_solutions.begin(); sol != sim_failures.optional_solutions.end(); ++sol) { // check if any optional solutions could result in the failure of more important a goal; invalidate the culprits.
        if ((*sol).second->is_invalidated()) {
            continue;
        }

        if ((*sol).first->get_strength(now) > monitored_goal->get_strength(now)) {
            (*sol).second->invalidate();
        }
    }

    Sim *best_sol = nullptr;

    for (sol = sim_successes.optional_solutions.begin(); sol != sim_successes.optional_solutions.end(); ++sol) { // find the best optional solution left.
        if ((*sol).second->is_invalidated()) {
            continue;
        }

        if (!best_sol) {
            best_sol = (*sol).second;
        } else {
            double s = (*sol).second->sol_cfd / ((*sol).second->sol_before - now);
            double _s = best_sol->sol_cfd / (best_sol->sol_before - now);

            if (s > _s) {
                best_sol = (*sol).second;
            }
        }
    }

    invalidate_sim_outcomes(); // this stops any further propagation of the goal simulation.

    if (best_sol) {
        ((PrimaryMDLController *)(*sol).second->sol)->abduce(bindings, best_sol->super_goal, best_sol->opposite, goal_target->get_cfd());

        for (sol = sim_successes.mandatory_solutions.begin(); sol != sim_successes.mandatory_solutions.end(); ++sol) { // commit to all mandatory solutions.
            ((PrimaryMDLController *)(*sol).second->sol)->abduce(bindings, (*sol).second->super_goal, (*sol).second->opposite, goal_target->get_cfd());
        }
    }
}